

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  bool bVar1;
  SnapPromiseAllSettledResolveOrRejectElementFunctionInfo *capabilityInfo;
  ScriptContext *ctx;
  JavascriptPromiseCapability *capabilities;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *pJVar2;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *pJVar3;
  RecyclableObject *pRVar4;
  
  capabilityInfo =
       SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)32>
                 (snpObject);
  ctx = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  capabilities = NSSnapValues::InflatePromiseCapabilityInfo
                           (&capabilityInfo->Capabilities,ctx,inflator);
  bVar1 = InflateMap::
          IsPromiseInfoDefined<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>
                    (inflator,capabilityInfo->RemainingElementsWrapperId);
  if (!bVar1) {
    pJVar2 = Js::JavascriptLibrary::CreateRemainingElementsWrapper_TTD
                       ((ctx->super_ScriptContextBase).javascriptLibrary,ctx,
                        capabilityInfo->RemainingElementsValue);
    InflateMap::
    AddInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>
              (inflator,capabilityInfo->RemainingElementsWrapperId,pJVar2);
  }
  pJVar2 = InflateMap::
           LookupInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>
                     (inflator,capabilityInfo->RemainingElementsWrapperId);
  bVar1 = InflateMap::
          IsPromiseInfoDefined<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>
                    (inflator,capabilityInfo->AlreadyCalledWrapperId);
  if (!bVar1) {
    pJVar3 = Js::JavascriptLibrary::CreateAlreadyCalledWrapper_TTD
                       ((ctx->super_ScriptContextBase).javascriptLibrary,ctx,
                        capabilityInfo->AlreadyCalledValue);
    InflateMap::
    AddInflatedPromiseInfo<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>
              (inflator,capabilityInfo->AlreadyCalledWrapperId,pJVar3);
  }
  pJVar3 = InflateMap::
           LookupInflatedPromiseInfo<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>
                     (inflator,capabilityInfo->AlreadyCalledWrapperId);
  pRVar4 = InflateMap::LookupObject(inflator,capabilityInfo->Values);
  pRVar4 = Js::JavascriptLibrary::CreatePromiseAllSettledResolveOrRejectElementFunction_TTD
                     ((ctx->super_ScriptContextBase).javascriptLibrary,capabilities,
                      capabilityInfo->Index,pJVar2,pRVar4,pJVar3,capabilityInfo->IsRejecting);
  return pRVar4;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            const SnapPromiseAllSettledResolveOrRejectElementFunctionInfo* aInfo = SnapObjectGetAddtlInfoAs<SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*, SnapObjectType::SnapPromiseAllSettledResolveOrRejectElementFunctionObject>(snpObject);
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::JavascriptPromiseCapability* capabilities = InflatePromiseCapabilityInfo(&aInfo->Capabilities, ctx, inflator);

            if(!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>(aInfo->RemainingElementsWrapperId))
            {
                Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingWrapper = ctx->GetLibrary()->CreateRemainingElementsWrapper_TTD(ctx, aInfo->RemainingElementsValue);
                inflator->AddInflatedPromiseInfo(aInfo->RemainingElementsWrapperId, remainingWrapper);
            }
            Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* wrapper = inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>(aInfo->RemainingElementsWrapperId);

            if (!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>(aInfo->AlreadyCalledWrapperId))
            {
                Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper = ctx->GetLibrary()->CreateAlreadyCalledWrapper_TTD(ctx, aInfo->AlreadyCalledValue);
                inflator->AddInflatedPromiseInfo(aInfo->AlreadyCalledWrapperId, alreadyCalledWrapper);
            }
            Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper = inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>(aInfo->AlreadyCalledWrapperId);

            Js::RecyclableObject* values = inflator->LookupObject(aInfo->Values);

            return ctx->GetLibrary()->CreatePromiseAllSettledResolveOrRejectElementFunction_TTD(capabilities, aInfo->Index, wrapper, values, alreadyCalledWrapper, aInfo->IsRejecting);
        }